

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O1

Vec_Int_t * Fra_OneHotCompute(Fra_Man_t *p,Fra_Sml_t *pSim)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  uint Entry;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  long lVar10;
  uint Entry_00;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  
  pAVar3 = pSim->pAig;
  if (pAVar3 != p->pManAig) {
    __assert_fail("pSim->pAig == p->pManAig",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraHot.c"
                  ,0x8d,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
  }
  uVar15 = pAVar3->nObjs[2] - pAVar3->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  pVVar8 = pSim->pAig->vCis;
  if ((int)uVar15 < pVVar8->nSize) {
    uVar14 = (ulong)uVar15;
    uVar16 = uVar15;
    do {
      uVar16 = uVar16 + 1;
      if ((int)uVar15 < 0) {
LAB_005cbced:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = pSim->nWordsTotal;
      iVar2 = pSim->nWordsPref;
      if (iVar2 < iVar1) {
        pvVar4 = pVVar8->pArray[uVar14];
        lVar10 = 0;
        do {
          if (*(int *)((long)&pSim[1].pAig +
                      lVar10 * 4 +
                      (long)(*(int *)((long)pvVar4 + 0x24) * iVar1) * 4 + (long)iVar2 * 4) != 0) {
            uVar6 = (int)uVar14 - uVar15;
            if ((int)uVar6 < 0) {
              __assert_fail("i-nTruePis >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraHot.c"
                            ,0x93,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
            }
            pVVar8 = pSim->pAig->vCis;
            if ((int)uVar14 + 1 < pVVar8->nSize) {
              Entry = ~uVar6;
              uVar5 = (ulong)uVar16;
              uVar17 = uVar14;
              goto LAB_005cbb73;
            }
            break;
          }
          lVar10 = lVar10 + 1;
        } while (iVar1 - iVar2 != (int)lVar10);
      }
LAB_005cbcc4:
      uVar14 = uVar14 + 1;
      pVVar8 = pSim->pAig->vCis;
    } while ((int)uVar14 < pVVar8->nSize);
  }
  return p_00;
LAB_005cbb73:
  uVar9 = uVar5;
  if (-2 < (int)uVar17) {
    iVar1 = pSim->nWordsTotal;
    iVar2 = pSim->nWordsPref;
    if (iVar2 < iVar1) {
      lVar10 = (long)(*(int *)((long)pVVar8->pArray[uVar9] + 0x24) * iVar1) * 4 + (long)iVar2 * 4;
      lVar11 = 0;
      do {
        if (*(int *)((long)&pSim[1].pAig + lVar11 * 4 + lVar10) != 0) {
          if (iVar2 < iVar1) {
            lVar11 = (long)(*(int *)((long)pvVar4 + 0x24) * iVar1) * 4 + (long)iVar2 * 4;
            lVar12 = 0;
            goto LAB_005cbbf2;
          }
          break;
        }
        lVar11 = lVar11 + 1;
      } while (iVar1 - iVar2 != (int)lVar11);
    }
    goto LAB_005cbc81;
  }
  goto LAB_005cbced;
  while (lVar12 = lVar12 + 1, iVar1 - iVar2 != (int)lVar12) {
LAB_005cbbf2:
    if (*(int *)((long)&pSim[1].pAig + lVar12 * 4 + lVar11) !=
        *(int *)((long)&pSim[1].pAig + lVar12 * 4 + lVar10)) {
      uVar13 = (int)uVar9 - uVar15;
      if ((int)uVar13 < 0) {
        __assert_fail("k-nTruePis >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraHot.c"
                      ,0x9c,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
      }
      Entry_00 = Entry;
      if (iVar1 <= iVar2) goto LAB_005cbc5e;
      lVar12 = 0;
      goto LAB_005cbc1f;
    }
  }
  goto LAB_005cbc81;
  while (lVar12 = lVar12 + 1, iVar1 - iVar2 != (int)lVar12) {
LAB_005cbc1f:
    if ((*(uint *)((long)&pSim[1].pAig + lVar12 * 4 + lVar11) &
        *(uint *)((long)&pSim[1].pAig + lVar12 * 4 + lVar10)) != 0) {
      Entry_00 = uVar6 + 1;
      if (iVar2 < iVar1) {
        lVar12 = 0;
        goto LAB_005cbc44;
      }
      break;
    }
  }
  goto LAB_005cbc5e;
  while (lVar12 = lVar12 + 1, iVar1 - iVar2 != (int)lVar12) {
LAB_005cbc44:
    if ((*(uint *)((long)&pSim[1].pAig + lVar12 * 4 + lVar10) &
        ~*(uint *)((long)&pSim[1].pAig + lVar12 * 4 + lVar11)) != 0) {
      if (iVar1 <= iVar2) goto LAB_005cbcb3;
      lVar12 = 0;
      goto LAB_005cbc9f;
    }
  }
LAB_005cbc5e:
  Vec_IntPush(p_00,Entry_00);
  uVar13 = ~uVar13;
LAB_005cbc69:
  Vec_IntPush(p_00,uVar13);
LAB_005cbc81:
  pVVar8 = pSim->pAig->vCis;
  uVar5 = uVar9 + 1;
  uVar17 = uVar9;
  if (pVVar8->nSize <= (int)(uVar9 + 1)) goto LAB_005cbcc4;
  goto LAB_005cbb73;
  while (lVar12 = lVar12 + 1, iVar1 - iVar2 != (int)lVar12) {
LAB_005cbc9f:
    if ((*(uint *)((long)&pSim[1].pAig + lVar12 * 4 + lVar11) &
        ~*(uint *)((long)&pSim[1].pAig + lVar12 * 4 + lVar10)) != 0) goto LAB_005cbc81;
  }
LAB_005cbcb3:
  Vec_IntPush(p_00,Entry);
  uVar13 = uVar13 + 1;
  goto LAB_005cbc69;
}

Assistant:

Vec_Int_t * Fra_OneHotCompute( Fra_Man_t * p, Fra_Sml_t * pSim )
{
    int fSkipConstEqu = 1;
    Vec_Int_t * vOneHots;
    Aig_Obj_t * pObj1, * pObj2;
    int i, k;
    int nTruePis = Aig_ManCiNum(pSim->pAig) - Aig_ManRegNum(pSim->pAig);
    assert( pSim->pAig == p->pManAig );
    vOneHots = Vec_IntAlloc( 100 );
    Aig_ManForEachLoSeq( pSim->pAig, pObj1, i )
    {
        if ( fSkipConstEqu && Fra_OneHotNodeIsConst(pSim, pObj1) )
            continue;
        assert( i-nTruePis >= 0 );
//        Aig_ManForEachLoSeq( pSim->pAig, pObj2, k )
//        Vec_PtrForEachEntryStart( Aig_Obj_t *, pSim->pAig->vPis, pObj2, k, Aig_ManCiNum(p)-Aig_ManRegNum(p) )
        Vec_PtrForEachEntryStart( Aig_Obj_t *, pSim->pAig->vCis, pObj2, k, i+1 )
        {
            if ( fSkipConstEqu && Fra_OneHotNodeIsConst(pSim, pObj2) )
                continue;
            if ( fSkipConstEqu && Fra_OneHotNodesAreEqual( pSim, pObj1, pObj2 ) )
                continue;
            assert( k-nTruePis >= 0 );
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 1, 1 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 1) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 1) );
                continue;
            }
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 0, 1 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 0) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 1) );
                continue;
            }
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 1, 0 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 1) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 0) );
                continue;
            }
        }
    }
    return vOneHots;
}